

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_stateless_hrr_aad_change(void)

{
  int iVar1;
  ptls_t *tls;
  ptls_t *tls_00;
  size_t sStack_e0;
  int ret;
  size_t consumed;
  ptls_buffer_t sbuf;
  ptls_buffer_t cbuf;
  ptls_handshake_properties_t server_hs_prop;
  ptls_t *server;
  ptls_t *client;
  
  memset(&cbuf.is_allocated,0,0x80);
  ptls_iovec_init("1.2.3.4:1234",0xc);
  tls = stateless_hrr_prepare
                  ((ptls_buffer_t *)&consumed,(ptls_handshake_properties_t *)&cbuf.is_allocated);
  ptls_buffer_init((ptls_buffer_t *)&sbuf.is_allocated,"",0);
  sStack_e0 = sbuf.capacity;
  iVar1 = ptls_handshake(tls,(ptls_buffer_t *)&sbuf.is_allocated,(void *)consumed,
                         &stack0xffffffffffffff20,(ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x46d);
  _ok((uint)(sbuf.capacity == sStack_e0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x46e);
  sbuf.capacity = 0;
  tls_00 = ptls_new(ctx_peer,1);
  ptls_iovec_init("1.2.3.4:4321",0xc);
  sStack_e0 = cbuf.capacity;
  iVar1 = ptls_handshake(tls_00,(ptls_buffer_t *)&consumed,(void *)sbuf._24_8_,
                         &stack0xffffffffffffff20,(ptls_handshake_properties_t *)&cbuf.is_allocated)
  ;
  _ok((uint)(iVar1 == 0x28),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x476);
  ptls_free(tls);
  ptls_free(tls_00);
  ptls_buffer_dispose((ptls_buffer_t *)&sbuf.is_allocated);
  ptls_buffer_dispose((ptls_buffer_t *)&consumed);
  return;
}

Assistant:

static void test_stateless_hrr_aad_change(void)
{
    ptls_t *client, *server;
    ptls_handshake_properties_t server_hs_prop = {{{{NULL}}}};
    ptls_buffer_t cbuf, sbuf;
    size_t consumed;
    int ret;

    server_hs_prop.server.cookie.key = "0123456789abcdef0123456789abcdef0123456789abcdef";
    server_hs_prop.server.cookie.additional_data = ptls_iovec_init("1.2.3.4:1234", 12);
    server_hs_prop.server.enforce_retry = 1;
    server_hs_prop.server.retry_uses_cookie = 1;

    client = stateless_hrr_prepare(&sbuf, &server_hs_prop);
    ptls_buffer_init(&cbuf, "", 0);

    consumed = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(sbuf.off == consumed);
    sbuf.off = 0;

    server = ptls_new(ctx_peer, 1);
    server_hs_prop.server.cookie.additional_data = ptls_iovec_init("1.2.3.4:4321", 12);

    consumed = cbuf.off;
    ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, &server_hs_prop);
    ok(ret == PTLS_ALERT_HANDSHAKE_FAILURE);

    ptls_free(client);
    ptls_free(server);

    ptls_buffer_dispose(&cbuf);
    ptls_buffer_dispose(&sbuf);
}